

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O3

void copy_slays(_Bool **dest,_Bool *source)

{
  slay_conflict *psVar1;
  _Bool _Var2;
  _Bool *p_Var3;
  ulong uVar4;
  _Bool *p_Var5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  
  if (source != (_Bool *)0x0) {
    p_Var3 = *dest;
    if (p_Var3 == (_Bool *)0x0) {
      p_Var3 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
      *dest = p_Var3;
    }
    uVar6 = (ulong)z_info->slay_max;
    if (uVar6 != 0) {
      uVar4 = 0;
      do {
        p_Var3[uVar4] = (_Bool)(p_Var3[uVar4] | source[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
      if (uVar6 != 0) {
        uVar4 = 0;
        do {
          if (uVar4 != 0) {
            psVar1 = slays + uVar4;
            piVar7 = &slays->multiplier;
            uVar8 = 0;
            do {
              if (((p_Var3[uVar4] == true) && (p_Var3[uVar8] == true)) &&
                 (_Var2 = same_monsters_slain((wchar_t)uVar4,(wchar_t)uVar8), _Var2)) {
                p_Var5 = p_Var3 + uVar8;
                if (psVar1->multiplier < *piVar7) {
                  p_Var5 = p_Var3 + uVar4;
                }
                *p_Var5 = false;
              }
              uVar8 = uVar8 + 1;
              piVar7 = piVar7 + 0xe;
            } while (uVar4 != uVar8);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar6);
      }
    }
  }
  return;
}

Assistant:

void copy_slays(bool **dest, bool *source)
{
	int i, j;

	/* Check structures */
	if (!source) return;
	if (!(*dest)) {
		*dest = mem_zalloc(z_info->slay_max * sizeof(bool));
	}

	/* Copy */
	for (i = 0; i < z_info->slay_max; i++) {
		(*dest)[i] |= source[i];
	}

	/* Check for duplicates */
	for (i = 0; i < z_info->slay_max; i++) {
		for (j = 0; j < i; j++) {
			if ((*dest)[i] && (*dest)[j] && same_monsters_slain(i, j)) {
				if (slays[i].multiplier < slays[j].multiplier) {
					(*dest)[i] = false;
				} else {
					(*dest)[j] = false;
				}
			}
		}
	}
}